

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

void __thiscall MetricsDiscovery::MDHelper::DeactivateMetricSet(MDHelper *this)

{
  int iVar1;
  long in_RDI;
  TCompletionCode res;
  
  if ((((*(byte *)(in_RDI + 0x20) & 1) != 0) && ((*(byte *)(in_RDI + 0x21) & 1) != 0)) &&
     (*(long *)(in_RDI + 0x50) != 0)) {
    iVar1 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x38))();
    *(bool *)(in_RDI + 0x21) = iVar1 != 0;
  }
  return;
}

Assistant:

void MDHelper::DeactivateMetricSet()
{
    if( !m_Initialized || !m_Activated || !m_MetricSet )
    {
        DebugPrint("Can't DeactivateMetricSet!\n");
        return;
    }

    TCompletionCode res = m_MetricSet->Deactivate();
    if( res != CC_OK ) { DebugPrint("DeactivateMetricSet failed!\n"); }

    m_Activated = res != CC_OK;
}